

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExport.c
# Opt level: O2

int Cudd_DumpBlif(DdManager *dd,int n,DdNode **f,char **inames,char **onames,char *mname,FILE *fp,
                 int mv)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  void *__ptr;
  ulong uVar4;
  DdNode *n_00;
  DdNode *pDVar5;
  ulong uVar6;
  
  uVar2 = dd->size;
  __ptr = malloc((long)(int)uVar2 * 4);
  if (__ptr == (void *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
LAB_0073ca8f:
    __ptr = (void *)0x0;
  }
  else {
    uVar4 = 0;
    uVar6 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar6 = uVar4;
    }
    for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      *(undefined4 *)((long)__ptr + uVar4 * 4) = 0;
    }
    n_00 = Cudd_VectorSupport(dd,f,n);
    if (n_00 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)n_00 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      for (pDVar5 = n_00; (ulong)pDVar5->index != 0x7fffffff; pDVar5 = (pDVar5->type).kids.T) {
        *(undefined4 *)((long)__ptr + (ulong)pDVar5->index * 4) = 1;
      }
      Cudd_RecursiveDeref(dd,n_00);
      if (mname == (char *)0x0) {
        iVar3 = fprintf((FILE *)fp,".model DD\n.inputs");
      }
      else {
        iVar3 = fprintf((FILE *)fp,".model %s\n.inputs",mname);
      }
      if (iVar3 != -1) {
        for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
          if (*(int *)((long)__ptr + uVar4 * 4) != 0) {
            if (inames == (char **)0x0) {
              iVar3 = fprintf((FILE *)fp," %d",uVar4 & 0xffffffff);
            }
            else {
              iVar3 = fprintf((FILE *)fp," %s",inames[uVar4]);
            }
            if (iVar3 == -1) goto LAB_0073cbf4;
          }
        }
        free(__ptr);
        __ptr = (void *)0x0;
        iVar3 = fprintf((FILE *)fp,"\n.outputs");
        if (iVar3 != -1) {
          uVar6 = 0;
          if (0 < n) {
            uVar6 = (ulong)(uint)n;
          }
          uVar4 = 0;
          do {
            if (uVar6 == uVar4) {
              __ptr = (void *)0x0;
              iVar3 = fprintf((FILE *)fp,"\n");
              if (iVar3 != -1) {
                iVar3 = Cudd_DumpBlifBody(dd,n,f,inames,onames,fp,mv);
                if (iVar3 == 0) goto LAB_0073ca8f;
                __ptr = (void *)0x0;
                iVar3 = fprintf((FILE *)fp,".end\n");
                if (iVar3 != -1) {
                  return 1;
                }
              }
              break;
            }
            if (onames == (char **)0x0) {
              iVar3 = fprintf((FILE *)fp," f%d",uVar4 & 0xffffffff);
            }
            else {
              iVar3 = fprintf((FILE *)fp," %s",onames[uVar4]);
            }
            uVar4 = uVar4 + 1;
          } while (iVar3 != -1);
        }
      }
    }
  }
LAB_0073cbf4:
  free(__ptr);
  return 0;
}

Assistant:

int
Cudd_DumpBlif(
  DdManager * dd /* manager */,
  int  n /* number of output nodes to be dumped */,
  DdNode ** f /* array of output nodes to be dumped */,
  char ** inames /* array of input names (or NULL) */,
  char ** onames /* array of output names (or NULL) */,
  char * mname /* model name (or NULL) */,
  FILE * fp /* pointer to the dump file */,
  int mv /* 0: blif, 1: blif-MV */)
{
    DdNode      *support = NULL;
    DdNode      *scan;
    int         *sorted = NULL;
    int         nvars = dd->size;
    int         retval;
    int         i;

    /* Build a bit array with the support of f. */
    sorted = ABC_ALLOC(int,nvars);
    if (sorted == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        goto failure;
    }
    for (i = 0; i < nvars; i++) sorted[i] = 0;

    /* Take the union of the supports of each output function. */
    support = Cudd_VectorSupport(dd,f,n);
    if (support == NULL) goto failure;
    cuddRef(support);
    scan = support;
    while (!cuddIsConstant(scan)) {
        sorted[scan->index] = 1;
        scan = cuddT(scan);
    }
    Cudd_RecursiveDeref(dd,support);
    support = NULL; /* so that we do not try to free it in case of failure */

    /* Write the header (.model .inputs .outputs). */
    if (mname == NULL) {
        retval = fprintf(fp,".model DD\n.inputs");
    } else {
        retval = fprintf(fp,".model %s\n.inputs",mname);
    }
    if (retval == EOF) {
        ABC_FREE(sorted);
        return(0);
    }

    /* Write the input list by scanning the support array. */
    for (i = 0; i < nvars; i++) {
        if (sorted[i]) {
            if (inames == NULL) {
                retval = fprintf(fp," %d", i);
            } else {
                retval = fprintf(fp," %s", inames[i]);
            }
            if (retval == EOF) goto failure;
        }
    }
    ABC_FREE(sorted);
    sorted = NULL;

    /* Write the .output line. */
    retval = fprintf(fp,"\n.outputs");
    if (retval == EOF) goto failure;
    for (i = 0; i < n; i++) {
        if (onames == NULL) {
            retval = fprintf(fp," f%d", i);
        } else {
            retval = fprintf(fp," %s", onames[i]);
        }
        if (retval == EOF) goto failure;
    }
    retval = fprintf(fp,"\n");
    if (retval == EOF) goto failure;

    retval = Cudd_DumpBlifBody(dd, n, f, inames, onames, fp, mv);
    if (retval == 0) goto failure;

    /* Write trailer and return. */
    retval = fprintf(fp,".end\n");
    if (retval == EOF) goto failure;

    return(1);

failure:
    if (sorted != NULL) ABC_FREE(sorted);
    if (support != NULL) Cudd_RecursiveDeref(dd,support);
    return(0);

}